

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffer::DetectHeader(CSVSniffer *this)

{
  CSVSniffer *this_00;
  bool bVar1;
  pointer this_01;
  CSVStateMachine *best_header_row;
  CSVBufferManager *pCVar2;
  MultiFileOptions *file_options;
  idx_t i;
  ulong uVar3;
  idx_t iVar4;
  CSVErrorHandler *in_stack_ffffffffffffff90;
  LogicalType local_60;
  CSVReaderOptions *local_48;
  CSVReaderOptions *pCStack_40;
  
  this_01 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
            ::operator->(&this->best_candidate);
  best_header_row = BaseScanner::GetStateMachine(&this_01->super_BaseScanner);
  pCVar2 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
  this_00 = (CSVSniffer *)pCVar2->context;
  local_48 = this->options;
  pCStack_40 = (CSVReaderOptions *)this->file_options;
  file_options = (MultiFileOptions *)
                 shared_ptr<duckdb::CSVErrorHandler,_true>::operator*(&this->error_handler);
  DetectHeaderInternal_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_60,this_00,(ClientContext *)&this->best_header_row,
             (vector<duckdb::HeaderValue,_true> *)best_header_row,
             (CSVStateMachine *)&this->set_columns,
             (SetColumns *)&this->best_sql_types_candidates_per_column_idx,
             (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
              *)local_48,pCStack_40,file_options,in_stack_ffffffffffffff90);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->names,&local_60);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_60);
  bVar1 = EmptyOrOnlyHeader(this);
  if (bVar1) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
              (&(this->detected_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(this->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      LogicalType::LogicalType(&local_60,BOOLEAN);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>
                (&(this->detected_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_60)
      ;
      LogicalType::~LogicalType(&local_60);
    }
  }
  for (iVar4 = this->max_columns_found;
      uVar3 = (long)(this->names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5, iVar4 < uVar3; iVar4 = iVar4 + 1
      ) {
    LogicalType::LogicalType(&local_60,VARCHAR);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
    emplace_back<duckdb::LogicalType>
              (&(this->detected_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_60);
    LogicalType::~LogicalType(&local_60);
  }
  this->max_columns_found = uVar3;
  return;
}

Assistant:

void CSVSniffer::DetectHeader() {
	auto &sniffer_state_machine = best_candidate->GetStateMachine();
	names = DetectHeaderInternal(buffer_manager->context, best_header_row, sniffer_state_machine, set_columns,
	                             best_sql_types_candidates_per_column_idx, options, file_options, *error_handler);
	if (EmptyOrOnlyHeader()) {
		// This file only contains a header, lets default to the lowest type of all.
		detected_types.clear();
		for (idx_t i = 0; i < names.size(); i++) {
			detected_types.push_back(LogicalType::BOOLEAN);
		}
	}
	for (idx_t i = max_columns_found; i < names.size(); i++) {
		detected_types.push_back(LogicalType::VARCHAR);
	}
	max_columns_found = names.size();
}